

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O2

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::ReplaceAccessChain
          (ReplaceDescArrayAccessUsingVarIndex *this,Instruction *var,Instruction *access_chain)

{
  uint32_t number_of_elements;
  DefUseManager *this_00;
  
  number_of_elements =
       descsroautil::GetNumberOfElementsForArrayOrStruct((this->super_Pass).context_,var);
  if (number_of_elements == 1) {
    UseConstIndexForAccessChain(this,access_chain,0);
    this_00 = Pass::get_def_use_mgr(&this->super_Pass);
    analysis::DefUseManager::AnalyzeInstUse(this_00,access_chain);
    return;
  }
  if (number_of_elements != 0) {
    ReplaceUsersOfAccessChain(this,access_chain,number_of_elements);
    return;
  }
  __assert_fail("number_of_elements != 0 && \"Number of element is 0\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp"
                ,0x52,
                "void spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::ReplaceAccessChain(Instruction *, Instruction *) const"
               );
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::ReplaceAccessChain(
    Instruction* var, Instruction* access_chain) const {
  uint32_t number_of_elements =
      descsroautil::GetNumberOfElementsForArrayOrStruct(context(), var);
  assert(number_of_elements != 0 && "Number of element is 0");
  if (number_of_elements == 1) {
    UseConstIndexForAccessChain(access_chain, 0);
    get_def_use_mgr()->AnalyzeInstUse(access_chain);
    return;
  }
  ReplaceUsersOfAccessChain(access_chain, number_of_elements);
}